

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask29_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x1d | uVar1;
  uVar2 = uVar2 >> 3;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[2] = uVar1;
  uVar2 = in[3];
  out[2] = uVar2 << 0x17 | uVar1;
  uVar2 = uVar2 >> 9;
  out[3] = uVar2;
  uVar1 = in[4];
  out[3] = uVar1 << 0x14 | uVar2;
  uVar1 = uVar1 >> 0xc;
  out[4] = uVar1;
  uVar2 = in[5];
  out[4] = uVar2 << 0x11 | uVar1;
  uVar2 = uVar2 >> 0xf;
  out[5] = uVar2;
  uVar1 = in[6];
  out[5] = uVar1 << 0xe | uVar2;
  uVar1 = uVar1 >> 0x12;
  out[6] = uVar1;
  uVar2 = in[7];
  out[6] = uVar2 << 0xb | uVar1;
  uVar2 = uVar2 >> 0x15;
  out[7] = uVar2;
  uVar1 = in[8];
  out[7] = uVar1 << 8 | uVar2;
  uVar1 = uVar1 >> 0x18;
  out[8] = uVar1;
  uVar2 = in[9];
  out[8] = uVar2 << 5 | uVar1;
  uVar2 = uVar2 >> 0x1b;
  out[9] = uVar2;
  uVar2 = in[10] << 2 | uVar2;
  out[9] = uVar2;
  uVar1 = in[0xb];
  out[9] = uVar1 << 0x1f | uVar2;
  uVar1 = uVar1 >> 1;
  out[10] = uVar1;
  uVar2 = in[0xc];
  out[10] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[0xb] = uVar2;
  uVar1 = in[0xd];
  out[0xb] = uVar1 << 0x19 | uVar2;
  uVar1 = uVar1 >> 7;
  out[0xc] = uVar1;
  uVar2 = in[0xe];
  out[0xc] = uVar2 << 0x16 | uVar1;
  uVar2 = uVar2 >> 10;
  out[0xd] = uVar2;
  uVar1 = in[0xf];
  out[0xd] = uVar1 << 0x13 | uVar2;
  uVar1 = uVar1 >> 0xd;
  out[0xe] = uVar1;
  uVar2 = in[0x10];
  out[0xe] = uVar2 << 0x10 | uVar1;
  uVar2 = uVar2 >> 0x10;
  out[0xf] = uVar2;
  uVar1 = in[0x11];
  out[0xf] = uVar1 << 0xd | uVar2;
  uVar1 = uVar1 >> 0x13;
  out[0x10] = uVar1;
  uVar2 = in[0x12];
  out[0x10] = uVar2 << 10 | uVar1;
  uVar2 = uVar2 >> 0x16;
  out[0x11] = uVar2;
  uVar1 = in[0x13];
  out[0x11] = uVar1 << 7 | uVar2;
  uVar1 = uVar1 >> 0x19;
  out[0x12] = uVar1;
  uVar2 = in[0x14];
  out[0x12] = uVar2 << 4 | uVar1;
  uVar2 = uVar2 >> 0x1c;
  out[0x13] = uVar2;
  uVar2 = in[0x15] * 2 | uVar2;
  out[0x13] = uVar2;
  uVar1 = in[0x16];
  out[0x13] = uVar1 << 0x1e | uVar2;
  uVar1 = uVar1 >> 2;
  out[0x14] = uVar1;
  uVar2 = in[0x17];
  out[0x14] = uVar2 << 0x1b | uVar1;
  uVar2 = uVar2 >> 5;
  out[0x15] = uVar2;
  uVar1 = in[0x18];
  out[0x15] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[0x16] = uVar1;
  uVar2 = in[0x19];
  out[0x16] = uVar2 << 0x15 | uVar1;
  uVar2 = uVar2 >> 0xb;
  out[0x17] = uVar2;
  uVar1 = in[0x1a];
  out[0x17] = uVar1 << 0x12 | uVar2;
  uVar1 = uVar1 >> 0xe;
  out[0x18] = uVar1;
  uVar2 = in[0x1b];
  out[0x18] = uVar2 << 0xf | uVar1;
  uVar2 = uVar2 >> 0x11;
  out[0x19] = uVar2;
  uVar1 = in[0x1c];
  out[0x19] = uVar1 << 0xc | uVar2;
  uVar1 = uVar1 >> 0x14;
  out[0x1a] = uVar1;
  uVar2 = in[0x1d];
  out[0x1a] = uVar2 << 9 | uVar1;
  uVar2 = uVar2 >> 0x17;
  out[0x1b] = uVar2;
  uVar1 = in[0x1e];
  out[0x1b] = uVar1 << 6 | uVar2;
  uVar1 = uVar1 >> 0x1a;
  out[0x1c] = uVar1;
  out[0x1c] = in[0x1f] << 3 | uVar1;
  return out + 0x1d;
}

Assistant:

uint32_t *__fastpackwithoutmask29_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (29 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (29 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (29 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (29 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (29 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (29 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (29 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (29 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++out;
  *out = ((*in)) >> (29 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (29 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (29 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (29 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (29 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (29 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (29 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++out;
  *out = ((*in)) >> (29 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (29 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++out;
  *out = ((*in)) >> (29 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  *out = ((*in)) >> (29 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (29 - 27);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (29 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (29 - 21);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (29 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (29 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (29 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (29 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++out;
  *out = ((*in)) >> (29 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  *out = ((*in)) >> (29 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++out;
  ++in;

  return out;
}